

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O3

error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_> * __thiscall
pstore::romfs::romfs::parse_path
          (error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_> *__return_storage_ptr__,
          romfs *this,not_null<const_char_*> path,not_null<const_pstore::romfs::directory_*> dir)

{
  char *pcVar1;
  undefined8 uVar2;
  char cVar3;
  error_code *peVar4;
  iterator __name;
  unsigned_long length;
  iterator iVar5;
  not_null<const_pstore::romfs::directory_*> *pnVar6;
  not_null<const_pstore::romfs::dirent_*> *this_00;
  long value;
  error_code eVar7;
  error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> eo_directory;
  type local_60;
  type local_58;
  anon_union_16_2_eb5a95ea_for_error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>_1
  local_50;
  char local_40;
  directory *local_38;
  
  if (dir.ptr_ == (directory *)0x0 || path.ptr_ == (char *)0x0) {
    get_romfs_error_category();
    __return_storage_ptr__->has_error_ = true;
LAB_001809dd:
    peVar4 = error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>::
             error_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>&,std::error_code>
                       (__return_storage_ptr__);
    peVar4->_M_value = 2;
LAB_001809e8:
    peVar4->_M_cat = &get_romfs_error_category::cat.super_error_category;
  }
  else {
    if (*path.ptr_ == '/') {
      dir.ptr_ = (this->root_).ptr_;
      do {
        pcVar1 = path.ptr_ + 1;
        path.ptr_ = path.ptr_ + 1;
      } while (*pcVar1 == '/');
      local_50.storage_ = (type)path.ptr_;
      pstore::gsl::not_null<const_char_*>::ensure_invariant
                ((not_null<const_char_*> *)&local_50.storage_);
      path.ptr_ = (char *)local_50.storage_;
    }
    __name.pos_ = (pointer)directory_to_dirent(dir);
    if (((__name.pos_)->stat_).mode != directory) {
      assert_failed("current_de->is_directory ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/romfs/romfs.cpp"
                    ,0x143);
    }
    cVar3 = *path.ptr_;
    if (cVar3 != '\0') {
      do {
        value = 0;
        while ((cVar3 != '\0' && (cVar3 != '/'))) {
          pcVar1 = path.ptr_ + 1 + value;
          value = value + 1;
          cVar3 = *pcVar1;
        }
        local_58 = (type)(value + (long)path.ptr_);
        pstore::gsl::not_null<const_char_*>::ensure_invariant
                  ((not_null<const_char_*> *)&local_58.__align);
        local_50.storage_ = (type)((long)local_58 - 1);
        do {
          pcVar1 = (char *)((long)local_50.storage_ + 1);
          local_50.storage_ = (type)((long)local_50.storage_ + 1);
        } while (*pcVar1 == '/');
        pstore::gsl::not_null<const_char_*>::ensure_invariant
                  ((not_null<const_char_*> *)&local_50.storage_);
        uVar2 = local_50.storage_;
        if ((ulong)(value + (long)path.ptr_) <= path.ptr_) {
          assert_failed("tail > component",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/romfs/romfs.cpp"
                        ,0x14b);
        }
        local_60 = (type)path.ptr_;
        pstore::gsl::not_null<const_char_*>::ensure_invariant
                  ((not_null<const_char_*> *)&local_60.__align);
        length = unsigned_cast<long,unsigned_long,void>(value);
        __name = directory::find(dir.ptr_,(not_null<const_char_*>)local_60.__align,length);
        iVar5 = directory::end(dir.ptr_);
        if (__name.pos_ == iVar5.pos_) {
          get_romfs_error_category();
          __return_storage_ptr__->has_error_ = true;
          goto LAB_001809dd;
        }
        if (((__name.pos_)->stat_).mode != directory) {
          if (*(char *)uVar2 != '\0') {
            get_romfs_error_category();
            __return_storage_ptr__->has_error_ = true;
            peVar4 = error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>::
                     error_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>&,std::error_code>
                               (__return_storage_ptr__);
            peVar4->_M_value = 0x14;
            goto LAB_001809e8;
          }
          break;
        }
        dirent::opendir((dirent *)&local_50,(char *)__name.pos_);
        cVar3 = local_40;
        if (local_40 == '\x01') {
          eVar7 = error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::get_error
                            ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)
                             &local_50);
          __return_storage_ptr__->has_error_ = true;
          local_38 = dir.ptr_;
          peVar4 = error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>::
                   error_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>&,std::error_code>
                             (__return_storage_ptr__);
          peVar4->_M_value = eVar7._M_value;
          peVar4->_M_cat = eVar7._M_cat;
          dir.ptr_ = local_38;
        }
        else {
          pnVar6 = error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
                   value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,pstore::gsl::not_null<pstore::romfs::directory_const*>>
                             ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)
                              &local_50);
          dir.ptr_ = pnVar6->ptr_;
        }
        if (local_40 == '\0') {
          error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
          value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,pstore::gsl::not_null<pstore::romfs::directory_const*>>
                    ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)&local_50
                    );
        }
        else {
          error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
          error_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,std::error_code>
                    ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)&local_50
                    );
        }
        if (cVar3 != '\0') {
          return __return_storage_ptr__;
        }
        cVar3 = *(char *)uVar2;
        path.ptr_ = (char *)uVar2;
      } while (cVar3 != '\0');
    }
    __return_storage_ptr__->has_error_ = false;
    this_00 = error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>::
              value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>&,pstore::gsl::not_null<pstore::romfs::dirent_const*>>
                        (__return_storage_ptr__);
    this_00->ptr_ = __name.pos_;
    pstore::gsl::not_null<const_pstore::romfs::dirent_*>::ensure_invariant(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

auto romfs::parse_path (not_null<czstring> const path,
                                not_null<directory const *> dir) const -> error_or<dirent_ptr> {
            if (path.get () == nullptr || dir.get () == nullptr) {
                return error_or<dirent_ptr> (make_error_code (error_code::enoent));
            }

            auto p = path;
            if (p[0] == '/') {
                dir = root_;
                p = next_component (path);
            }

            dirent const * current_de = directory_to_dirent (dir);
            PSTORE_ASSERT (current_de->is_directory ());
            while (*p != '\0') {
                char const * component;
                char const * tail;
                std::tie (component, tail) = path_component (p);
                // note that component is not null terminated!
                p = next_component (tail);

                PSTORE_ASSERT (tail > component);
                auto const component_pos = dir->find (component, unsigned_cast (tail - component));
                if (component_pos == dir->end ()) {
                    // name not found
                    return error_or<dirent_ptr>{make_error_code (error_code::enoent)};
                }

                current_de = &*component_pos;
                if (current_de->is_directory ()) {
                    auto eo_directory = current_de->opendir ();
                    if (!eo_directory) {
                        return error_or<dirent_ptr>{eo_directory.get_error ()};
                    }
                    dir = eo_directory.get ();
                } else if (*p != '\0') {
                    // not a directory and wasn't the last component.
                    return error_or<dirent_ptr> (make_error_code (error_code::enotdir));
                }
            }
            return error_or<dirent_ptr>{current_de};
        }